

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

char * __thiscall
MeCab::anon_unknown_0::LatticeImpl::toStringInternal(LatticeImpl *this,Node *node,StringBuffer *os)

{
  bool bVar1;
  char *pcVar2;
  size_t in_RCX;
  StringBuffer *in_RDX;
  long in_RSI;
  long *in_RDI;
  Lattice *in_stack_00000020;
  Writer *in_stack_00000028;
  char *local_8;
  
  StringBuffer::clear(in_RDX);
  if (in_RSI == 0) {
    (**(code **)(*in_RDI + 0x128))(in_RDI,"node is NULL");
    local_8 = (char *)0x0;
  }
  else {
    if (in_RDI[0x16] == 0) {
      StringBuffer::write(in_RDX,(int)*(undefined8 *)(in_RSI + 0x30),
                          (void *)(ulong)*(ushort *)(in_RSI + 0x44),in_RCX);
      StringBuffer::operator<<(in_RDX,(char)((ulong)in_RDI >> 0x38));
      StringBuffer::operator<<(in_RDX,(char *)in_RDI);
    }
    else {
      bVar1 = Writer::writeNode(in_stack_00000028,in_stack_00000020,(Node *)this,
                                (StringBuffer *)node);
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    StringBuffer::operator<<(in_RDX,(char)((ulong)in_RDI >> 0x38));
    pcVar2 = StringBuffer::str(in_RDX);
    if (pcVar2 == (char *)0x0) {
      (**(code **)(*in_RDI + 0x128))(in_RDI,"output buffer overflow");
      local_8 = (char *)0x0;
    }
    else {
      local_8 = StringBuffer::str(in_RDX);
    }
  }
  return local_8;
}

Assistant:

const char *LatticeImpl::toStringInternal(const Node *node,
                                          StringBuffer *os) {
  os->clear();
  if (!node) {
    set_what("node is NULL");
    return 0;
  }
  if (writer_) {
    if (!writer_->writeNode(this, node, os)) {
      return 0;
    }
  } else {
    os->write(node->surface, node->length);
    *os << '\t' << node->feature;
  }
  *os << '\0';
  if (!os->str()) {
    set_what("output buffer overflow");
    return 0;
  }
  return os->str();
}